

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall Logger::addLogQueue(Logger *this,LogLevel level,string *message)

{
  value_type *__x;
  Logger *in_RDX;
  long in_RDI;
  unique_lock<std::mutex> lock;
  string datetime;
  mutex_type *in_stack_ffffffffffffff48;
  unique_lock<std::mutex> *in_stack_ffffffffffffff50;
  LogMessage *this_00;
  undefined1 local_98 [96];
  string local_38 [32];
  
  getDateTime_abi_cxx11_(in_RDX);
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __x = (value_type *)(in_RDI + 0x2f8);
  this_00 = (LogMessage *)local_98;
  std::__cxx11::string::string((string *)this_00,local_38);
  std::__cxx11::string::string((string *)(local_98 + 0x20),(string *)in_RDX);
  std::queue<LogMessage,_std::deque<LogMessage,_std::allocator<LogMessage>_>_>::push
            ((queue<LogMessage,_std::deque<LogMessage,_std::allocator<LogMessage>_>_> *)this_00,__x)
  ;
  LogMessage::~LogMessage(this_00);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

inline void addLogQueue(LogLevel level, const std::string& message) // 添加到日志队列中
    {
        std::string datetime = getDateTime();
        std::unique_lock<std::mutex> lock(logQueueMtx);
        logQueue.push({level, datetime, message});
        cv.notify_one(); // 唤醒等待的线程
    }